

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_exception_handler_test.cpp
# Opt level: O3

void __thiscall
GenericExceptionCatcher_Tests::generic_catcher_with_custom_action::test_method
          (generic_catcher_with_custom_action *this)

{
  undefined4 *puVar1;
  GenericExceptionHandler<void,_mittens::UnHandler<int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_adishavit[P]mittens_tests_generic_exception_handler_test_cpp:114:61)>
  allCatcher;
  int hit;
  
  puVar1 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar1 = 0;
  __cxa_throw(puVar1,&int::typeinfo,0);
}

Assistant:

BOOST_AUTO_TEST_CASE(generic_catcher_with_custom_action)
{
   int hit=0;
   {
      auto allCatcher = generic_handler<void>(EXIT_FAILURE, [&hit](){ ++hit; }, UnHandler<>());
      {
         try
         {
            throw_int();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(0,hit);
            BOOST_CHECK_EQUAL(EXIT_FAILURE, allCatcher.handleException());
            BOOST_CHECK_EQUAL(1,hit);
         }
      }
   }

   {
      auto stdExceptionCatcher = generic_handler<std::exception>(EXIT_FAILURE, [&hit](std::exception&){ ++hit; }, UnHandler<>());
      {
         try
         {
            throw_std_exception();
         }
         catch (...)
         {
            BOOST_CHECK_EQUAL(1,hit);
            BOOST_CHECK_EQUAL(EXIT_FAILURE, stdExceptionCatcher.handleException());
            BOOST_CHECK_EQUAL(2,hit);
         }
      }
   }
}